

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::~ControlElement(ControlElement<QMdi::ControlLabel> *this)

{
  ControlLabel *in_RDI;
  
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d17938;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__ControlElement_00d17ae8;
  QPointer<QMdiSubWindow>::~QPointer((QPointer<QMdiSubWindow> *)0x63b60f);
  ControlLabel::~ControlLabel(in_RDI);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }